

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O0

Program * get_program(void)

{
  Program *pPVar1;
  Queue *pQVar2;
  Map *pMVar3;
  Linkage *pLVar4;
  Program *ret;
  
  pPVar1 = (Program *)malloc(0x28);
  pQVar2 = (Queue *)malloc(0x18);
  pPVar1->translation_units = pQVar2;
  pQVar2 = (Queue *)malloc(0x18);
  pPVar1->source_files = pQVar2;
  pQVar2 = (Queue *)malloc(0x18);
  pPVar1->errors = pQVar2;
  pMVar3 = (Map *)malloc(0x810);
  pPVar1->types = pMVar3;
  pLVar4 = (Linkage *)malloc(0x810);
  pPVar1->external_linkage = pLVar4;
  Queue_Init(pPVar1->translation_units);
  Queue_Init(pPVar1->source_files);
  Queue_Init(pPVar1->errors);
  Map_Init(pPVar1->types);
  return pPVar1;
}

Assistant:

Program* get_program()
{
	struct Program *ret;
	ret=malloc(sizeof(struct Program));
	ret->translation_units=malloc(sizeof(struct Queue));
	ret->source_files=malloc(sizeof(struct Queue));
	ret->errors=malloc(sizeof(struct Queue));
	ret->types=malloc(sizeof(struct Map));
	ret->external_linkage=malloc(sizeof(struct Linkage));

	Queue_Init(ret->translation_units);
	Queue_Init(ret->source_files);
	Queue_Init(ret->errors);



	Map_Init(ret->types);

	return ret;
}